

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftRigidDynamicsWorld::addSoftBody
          (btSoftRigidDynamicsWorld *this,btSoftBody *body,short collisionFilterGroup,
          short collisionFilterMask)

{
  undefined2 in_CX;
  undefined2 in_DX;
  btSoftBody *in_RSI;
  long in_RDI;
  short in_stack_0000005c;
  short in_stack_0000005e;
  btCollisionObject *in_stack_00000060;
  btCollisionWorld *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffe8;
  
  btAlignedObjectArray<btSoftBody_*>::push_back
            ((btAlignedObjectArray<btSoftBody_*> *)in_RSI,
             (btSoftBody **)CONCAT26(in_DX,CONCAT24(in_CX,in_stack_ffffffffffffffe8)));
  btSoftBody::setSoftBodySolver(in_RSI,*(btSoftBodySolver **)(in_RDI + 0x268));
  btCollisionWorld::addCollisionObject
            (in_stack_00000068,in_stack_00000060,in_stack_0000005e,in_stack_0000005c);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::addSoftBody(btSoftBody* body,short int collisionFilterGroup,short int collisionFilterMask)
{
	m_softBodies.push_back(body);

	// Set the soft body solver that will deal with this body
	// to be the world's solver
	body->setSoftBodySolver( m_softBodySolver );

	btCollisionWorld::addCollisionObject(body,
		collisionFilterGroup,
		collisionFilterMask);

}